

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::compute_expert_loss<true>(data *sm,example *ec)

{
  undefined4 uVar1;
  float fVar2;
  undefined8 *puVar3;
  long *plVar4;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float inv_weight;
  float label;
  vw *all;
  
  puVar3 = *(undefined8 **)(in_RDI + 0x6998);
  uVar1 = *(undefined4 *)(in_RSI + 0x6828);
  if (*(float *)(in_RDI + 0x6954) + *(float *)(in_RDI + 0x6958) <= 0.0) {
    *(undefined4 *)(in_RDI + 0x6958) = 0x3f800000;
    *(undefined4 *)(in_RDI + 0x6950) = *(undefined4 *)(in_RDI + 0x694c);
  }
  else {
    *(float *)(in_RDI + 0x6950) =
         *(float *)(in_RDI + 0x6958) * *(float *)(in_RDI + 0x694c) + *(float *)(in_RDI + 0x6950);
  }
  fVar5 = 1.0 / (*(float *)(in_RDI + 0x6954) + *(float *)(in_RDI + 0x6958));
  *(float *)(in_RDI + 0x6950) = fVar5 * *(float *)(in_RDI + 0x6950);
  *(undefined4 *)(in_RSI + 0x6850) = *(undefined4 *)(in_RDI + 0x6950);
  *(undefined4 *)(in_RSI + 0x68a8) = *(undefined4 *)(in_RDI + 0x6950);
  fVar2 = *(float *)(in_RDI + 0x6958);
  plVar4 = (long *)puVar3[0x6a9];
  fVar6 = (float)(**(code **)(*plVar4 + 8))(*(undefined4 *)(in_RDI + 0x694c),uVar1,plVar4,*puVar3);
  *(float *)(in_RDI + 0x695c) = fVar2 * fVar6 + *(float *)(in_RDI + 0x695c);
  *(float *)(in_RDI + 0x695c) = fVar5 * *(float *)(in_RDI + 0x695c);
  return;
}

Assistant:

void compute_expert_loss(data& sm, example& ec)
{
  vw& all = *sm.all;
  // add in the feature-based expert and normalize,
  float label = ec.l.simple.label;

  if (sm.net_weight + sm.net_feature_weight > 0.)
    sm.average_pred += sm.net_feature_weight * sm.feature_pred;
  else
  {
    sm.net_feature_weight = 1.;
    sm.average_pred = sm.feature_pred;
  }
  float inv_weight = 1.0f / (sm.net_weight + sm.net_feature_weight);
  sm.average_pred *= inv_weight;
  ec.pred.scalar = sm.average_pred;
  ec.partial_prediction = sm.average_pred;

  if (is_learn)
  {
    sm.alg_loss += sm.net_feature_weight * all.loss->getLoss(all.sd, sm.feature_pred, label);
    sm.alg_loss *= inv_weight;
  }
}